

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O2

void __thiscall
xray_re::xr_writer::w_raw_chunk(xr_writer *this,uint32_t id,void *data,size_t size,bool compress)

{
  undefined3 in_register_00000081;
  uint local_44;
  uint8_t *compressed_data;
  size_t compressed_size;
  
  if (CONCAT31(in_register_00000081,compress) == 0) {
    compressed_data._0_4_ = id;
    (*this->_vptr_xr_writer[2])(this,&compressed_data,4);
    compressed_data._0_4_ = (uint32_t)size;
    (*this->_vptr_xr_writer[2])(this,&compressed_data,4);
    (*this->_vptr_xr_writer[2])(this,data,size);
  }
  else {
    xr_lzhuf::compress(&compressed_data,&compressed_size,(uint8_t *)data,size);
    local_44 = id | 0x80000000;
    (*this->_vptr_xr_writer[2])(this,&local_44,4);
    local_44 = (uint)compressed_size;
    (*this->_vptr_xr_writer[2])(this,&local_44,4);
    (*this->_vptr_xr_writer[2])
              (this,CONCAT44(compressed_data._4_4_,(uint32_t)compressed_data),
               CONCAT44(compressed_size._4_4_,(uint)compressed_size));
    free((void *)CONCAT44(compressed_data._4_4_,(uint32_t)compressed_data));
  }
  return;
}

Assistant:

void xr_writer::w_raw_chunk(uint32_t id, const void* data, size_t size, bool compress)
{
	if (compress)
	{
		uint8_t* compressed_data;
		size_t compressed_size;
		xr_lzhuf::compress(compressed_data, compressed_size, (const uint8_t*)data, size);

		w_u32(id|xr_reader::CHUNK_COMPRESSED);
		w_size_u32(compressed_size);
		w_raw(compressed_data, compressed_size);

		free(compressed_data);
	}
	else
	{
		w_u32(id);
		w_size_u32(size);
		w_raw(data, size);
	}
}